

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

double __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
ReadConstant(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
             *this,char code)

{
  short sVar1;
  int iVar2;
  char in_SIL;
  BinaryReader<mp::internal::EndiannessConverter> *in_RDI;
  CStringRef unaff_retaddr;
  double value;
  BasicCStringRef<char> local_20;
  double local_18;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  
  local_18 = 0.0;
  if (in_SIL == 'l') {
    iVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(in_RDI);
    local_18 = (double)iVar2;
  }
  else if (in_SIL == 'n') {
    local_18 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(in_RDI);
  }
  else if (in_SIL == 's') {
    sVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<short>(in_RDI);
    local_18 = (double)(int)sVar1;
  }
  else {
    this_00 = in_RDI;
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_20,"expected constant");
    BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,unaff_retaddr);
  }
  BinaryReaderBase::ReadTillEndOfLine
            ((BinaryReaderBase *)(in_RDI->super_BinaryReaderBase).super_ReaderBase.ptr_);
  return local_18;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}